

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O1

Result __thiscall
ruckig::TargetCalculator<1UL,_ruckig::StandardVector>::calculate<true>
          (TargetCalculator<1UL,_ruckig::StandardVector> *this,
          InputParameter<1UL,_ruckig::StandardVector> *inp,
          Trajectory<1UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  double *t_sync;
  optional<double> *poVar1;
  Block *pBVar2;
  Profile *this_00;
  undefined8 *puVar3;
  double *pdVar4;
  double dVar5;
  ControlInterface CVar6;
  DurationDiscretization DVar7;
  ControlSigns CVar8;
  size_t sVar9;
  pointer paVar10;
  undefined8 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined8 uVar14;
  char cVar15;
  ControlInterface *pCVar16;
  Synchronization *pSVar17;
  RuckigError *pRVar18;
  long *plVar19;
  size_t sVar20;
  StandardVector<Synchronization,_1UL> *pSVar21;
  long lVar22;
  size_type *psVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  StandardVector<Block,_1UL> *pSVar27;
  pointer paVar28;
  long lVar29;
  StandardVector<Block,_1UL> *__src;
  long lVar30;
  unsigned_long uVar31;
  long lVar32;
  byte bVar33;
  long lVar34;
  bool *pbVar35;
  _Storage<unsigned_long,_true> _Var36;
  ulong uVar37;
  bool bVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  optional<double> t_min;
  PositionFirstOrderStep1 step1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68;
  Block *local_f48;
  StandardVector<Block,_1UL> *local_f40;
  _Storage<unsigned_long,_true> local_f38;
  char local_f30;
  StandardVector<Synchronization,_1UL> *local_f28;
  string local_f20;
  string local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  Container<double> *local_ec0;
  double local_eb8;
  long local_eb0;
  string local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  string local_e68;
  Profile local_e48 [6];
  
  *was_interrupted = false;
  local_eb8 = delta_time;
  std::vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
  ::resize(&traj->profiles,1);
  local_ec0 = &traj->cumulative_times;
  std::vector<double,_std::allocator<double>_>::resize(local_ec0,1);
  if (this->degrees_of_freedom == 0) {
    bVar38 = true;
  }
  else {
    local_f40 = (StandardVector<Block,_1UL> *)&inp->control_interface;
    local_f28 = (StandardVector<Synchronization,_1UL> *)&inp->synchronization;
    lVar24 = 0x19c;
    lVar34 = 0x1a4;
    lVar32 = 0;
    lVar26 = 0;
    uVar31 = 0;
    do {
      if ((inp->min_velocity).super__Optional_base<std::array<double,_1UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<double,_1UL>_>._M_engaged == true) {
        dVar39 = (&inp->max_jerk)[uVar31 + 1]._M_elems[0];
      }
      else {
        dVar39 = -(&inp->max_velocity)[uVar31]._M_elems[0];
      }
      paVar28 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (&this->inp_min_velocity)[uVar31]._M_elems[0] = dVar39;
      if ((inp->min_acceleration).super__Optional_base<std::array<double,_1UL>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::array<double,_1UL>_>._M_engaged == true) {
        dVar42 = (&inp->max_jerk)[uVar31 + 3]._M_elems[0];
      }
      else {
        dVar42 = -(&inp->max_acceleration)[uVar31]._M_elems[0];
      }
      (&this->inp_min_acceleration)[uVar31]._M_elems[0] = dVar42;
      pCVar16 = (ControlInterface *)
                ((long)&((InputParameter<1UL,_ruckig::StandardVector> *)
                        (&inp->current_position + -3))->degrees_of_freedom + lVar24);
      if ((inp->per_dof_control_interface).
          super__Optional_base<std::array<ruckig::ControlInterface,_1UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::ControlInterface,_1UL>_>._M_engaged ==
          false) {
        pCVar16 = (ControlInterface *)local_f40;
      }
      CVar6 = *pCVar16;
      (&this->inp_per_dof_control_interface)[uVar31]._M_elems[0] = CVar6;
      pSVar21 = (StandardVector<Synchronization,_1UL> *)
                ((long)&((InputParameter<1UL,_ruckig::StandardVector> *)
                        (&inp->current_position + -3))->degrees_of_freedom + lVar34);
      if ((inp->per_dof_synchronization).
          super__Optional_base<std::array<ruckig::Synchronization,_1UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::Synchronization,_1UL>_>._M_engaged ==
          false) {
        pSVar21 = local_f28;
      }
      (&this->inp_per_dof_synchronization)[uVar31]._M_elems[0] = pSVar21->_M_elems[0];
      if ((&inp->enabled)[uVar31]._M_elems[0] == false) {
        *(double *)((long)&paVar28->_M_elems[0].p + lVar26 + 0x38U) =
             (&inp->current_position)[uVar31]._M_elems[0];
        *(double *)((long)&paVar28->_M_elems[0].v + lVar26 + 0x38U) =
             (&inp->current_velocity)[uVar31]._M_elems[0];
        *(double *)((long)&paVar28->_M_elems[0].a + lVar26 + 0x38U) =
             (&inp->current_acceleration)[uVar31]._M_elems[0];
        *(undefined8 *)((long)&paVar28->_M_elems[0].t_sum + lVar26 + 0x30U) = 0;
        *(undefined8 *)((long)&(this->blocks)._M_elems[0].t_min + lVar32 * 4) = 0;
        if (*(char *)((long)&(this->blocks)._M_elems[0].a.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                             super__Optional_payload_base<ruckig::Block::Interval>._M_engaged +
                     lVar32 * 4) == '\x01') {
          *(undefined1 *)
           ((long)&(this->blocks)._M_elems[0].a.
                   super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged + lVar32 * 4) =
               0;
        }
        if (*(bool *)((long)(&this->inp_min_velocity + -1) + lVar32 * 4) == true) {
          *(bool *)((long)(&this->inp_min_velocity + -1) + lVar32 * 4) = false;
        }
      }
      else {
        local_eb0 = lVar24;
        if (CVar6 == Velocity) {
          dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
          if (ABS(dVar39) == INFINITY) {
            ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
          }
          else {
            ruckig::BrakeProfile::get_velocity_brake_trajectory
                      ((&inp->current_acceleration)[uVar31]._M_elems[0],
                       (&inp->max_acceleration)[uVar31]._M_elems[0],dVar42,dVar39);
          }
          dVar5 = (&inp->current_position)[uVar31]._M_elems[0];
          dVar39 = (&inp->current_velocity)[uVar31]._M_elems[0];
          dVar42 = (&inp->current_acceleration)[uVar31]._M_elems[0];
          dVar41 = (&inp->target_velocity)[uVar31]._M_elems[0];
          dVar40 = (&inp->target_acceleration)[uVar31]._M_elems[0];
          lVar24 = 0x220;
          lVar22 = 0x228;
          lVar25 = 0x128;
          lVar29 = 0xe8;
          lVar30 = 0xa8;
LAB_00151a55:
          *(double *)((long)&paVar28->_M_elems[0].t + lVar26 + lVar30) = dVar42;
          *(double *)((long)&paVar28->_M_elems[0].t + lVar26 + lVar29) = dVar39;
          *(double *)((long)&paVar28->_M_elems[0].t + lVar26 + lVar25) = dVar5;
          *(double *)((long)&paVar28->_M_elems[0].t + lVar26 + lVar22) = dVar40;
          *(double *)((long)&paVar28->_M_elems[0].t + lVar26 + lVar24) = dVar41;
        }
        else if (CVar6 == Position) {
          dVar41 = (&inp->max_jerk)[uVar31]._M_elems[0];
          if (ABS(dVar41) == INFINITY) {
            dVar41 = (&inp->max_acceleration)[uVar31]._M_elems[0];
            if (ABS(dVar41) != INFINITY) {
              ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                        ((&inp->current_velocity)[uVar31]._M_elems[0],
                         (&inp->max_velocity)[uVar31]._M_elems[0],dVar39,dVar41,dVar42);
            }
          }
          else {
            ruckig::BrakeProfile::get_position_brake_trajectory
                      ((&inp->current_velocity)[uVar31]._M_elems[0],
                       (&inp->current_acceleration)[uVar31]._M_elems[0],
                       (&inp->max_velocity)[uVar31]._M_elems[0],dVar39,
                       (&inp->max_acceleration)[uVar31]._M_elems[0],dVar42,dVar41);
          }
          dVar39 = (&inp->current_position)[uVar31]._M_elems[0];
          dVar42 = (&inp->current_velocity)[uVar31]._M_elems[0];
          dVar41 = (&inp->target_position)[uVar31]._M_elems[0];
          dVar40 = (&inp->target_velocity)[uVar31]._M_elems[0];
          dVar5 = (&inp->target_acceleration)[uVar31]._M_elems[0];
          *(double *)((long)&paVar28->_M_elems[0].a + lVar26) =
               (&inp->current_acceleration)[uVar31]._M_elems[0];
          lVar24 = 0x218;
          lVar22 = 0x220;
          lVar25 = 0x228;
          lVar29 = 0x128;
          lVar30 = 0xe8;
          goto LAB_00151a55;
        }
        if (ABS((&inp->max_jerk)[uVar31]._M_elems[0]) == INFINITY) {
          if (ABS((&inp->max_acceleration)[uVar31]._M_elems[0]) != INFINITY) {
            BrakeProfile::finalize_second_order
                      ((BrakeProfile *)((long)&paVar28->_M_elems[0].brake + lVar26),
                       (double *)((long)&paVar28->_M_elems[0].p + lVar26),
                       (double *)((long)&paVar28->_M_elems[0].v + lVar26),
                       (double *)((long)&paVar28->_M_elems[0].a + lVar26));
          }
        }
        else {
          BrakeProfile::finalize
                    ((BrakeProfile *)((long)&paVar28->_M_elems[0].brake + lVar26),
                     (double *)((long)&paVar28->_M_elems[0].p + lVar26),
                     (double *)((long)&paVar28->_M_elems[0].v + lVar26),
                     (double *)((long)&paVar28->_M_elems[0].a + lVar26));
        }
        pBVar2 = (Block *)((long)&paVar28->_M_elems[0].t + lVar26);
        CVar6 = (&this->inp_per_dof_control_interface)[uVar31]._M_elems[0];
        if (CVar6 == Velocity) {
          dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
          if (ABS(dVar39) == INFINITY) {
            local_f48 = pBVar2;
            ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                      ((VelocitySecondOrderStep1 *)local_e48,
                       *(double *)((long)&paVar28->_M_elems[0].v + lVar26),
                       *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x60U),
                       (&inp->max_acceleration)[uVar31]._M_elems[0],
                       (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
            cVar15 = ruckig::VelocitySecondOrderStep1::get_profile(local_e48,local_f48);
          }
          else {
            local_f48 = pBVar2;
            ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                      ((VelocityThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar28->_M_elems[0].v + lVar26),
                       *(double *)((long)&paVar28->_M_elems[0].a + lVar26),
                       *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x60U),
                       *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x68U),
                       (&inp->max_acceleration)[uVar31]._M_elems[0],
                       (&this->inp_min_acceleration)[uVar31]._M_elems[0],dVar39);
            cVar15 = ruckig::VelocityThirdOrderStep1::get_profile(local_e48,local_f48);
          }
        }
        else {
          if (CVar6 != Position) goto LAB_0015295c;
          dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
          if (ABS(dVar39) == INFINITY) {
            dVar39 = (&inp->max_acceleration)[uVar31]._M_elems[0];
            if (ABS(dVar39) == INFINITY) {
              local_f48 = pBVar2;
              ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                        ((PositionFirstOrderStep1 *)local_e48,
                         *(double *)((long)&paVar28->_M_elems[0].p + lVar26),
                         *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x58U),
                         (&inp->max_velocity)[uVar31]._M_elems[0],
                         (&this->inp_min_velocity)[uVar31]._M_elems[0]);
              cVar15 = ruckig::PositionFirstOrderStep1::get_profile(local_e48,local_f48);
            }
            else {
              local_f48 = pBVar2;
              ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                        ((PositionSecondOrderStep1 *)local_e48,
                         *(double *)((long)&paVar28->_M_elems[0].p + lVar26),
                         *(double *)((long)&paVar28->_M_elems[0].v + lVar26),
                         *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x58U),
                         *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x60U),
                         (&inp->max_velocity)[uVar31]._M_elems[0],
                         (&this->inp_min_velocity)[uVar31]._M_elems[0],dVar39,
                         (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
              cVar15 = ruckig::PositionSecondOrderStep1::get_profile(local_e48,local_f48);
            }
          }
          else {
            ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                      ((PositionThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar28->_M_elems[0].p + lVar26),
                       *(double *)((long)&paVar28->_M_elems[0].v + lVar26),
                       *(double *)((long)&paVar28->_M_elems[0].a + lVar26),
                       *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x58U),
                       *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x60U),
                       *(double *)((long)&paVar28->_M_elems[0].accel + lVar26 + 0x68U),
                       (&inp->max_velocity)[uVar31]._M_elems[0],
                       (&this->inp_min_velocity)[uVar31]._M_elems[0],
                       (&inp->max_acceleration)[uVar31]._M_elems[0],
                       (&this->inp_min_acceleration)[uVar31]._M_elems[0],dVar39);
            cVar15 = ruckig::PositionThirdOrderStep1::get_profile(local_e48,pBVar2);
          }
        }
        if (cVar15 == '\0') {
LAB_0015295c:
          dVar39 = (&inp->max_acceleration)[uVar31]._M_elems[0];
          if ((((dVar39 != 0.0) || (NAN(dVar39))) &&
              ((dVar39 = (&this->inp_min_acceleration)[uVar31]._M_elems[0], dVar39 != 0.0 ||
               (NAN(dVar39))))) &&
             ((dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0], dVar39 != 0.0 || (NAN(dVar39))))) {
            pRVar18 = (RuckigError *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_f20,uVar31);
            std::operator+(&local_ee0,"error in step 1, dof: ",&local_f20);
            plVar19 = (long *)std::__cxx11::string::append((char *)&local_ee0);
            local_f68._M_dataplus._M_p = (pointer)*plVar19;
            psVar23 = (size_type *)(plVar19 + 2);
            if ((size_type *)local_f68._M_dataplus._M_p == psVar23) {
              local_f68.field_2._M_allocated_capacity = *psVar23;
              local_f68.field_2._8_8_ = plVar19[3];
              local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
            }
            else {
              local_f68.field_2._M_allocated_capacity = *psVar23;
            }
            local_f68._M_string_length = plVar19[1];
            *plVar19 = (long)psVar23;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_f00,inp);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e48,&local_f68,&local_f00);
            RuckigError::RuckigError(pRVar18,(string *)local_e48);
            __cxa_throw(pRVar18,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
          }
          pRVar18 = (RuckigError *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_f20,uVar31);
          std::operator+(&local_ee0,"zero limits conflict in step 1, dof: ",&local_f20);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_ee0);
          local_f68._M_dataplus._M_p = (pointer)*plVar19;
          psVar23 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_f68._M_dataplus._M_p == psVar23) {
            local_f68.field_2._M_allocated_capacity = *psVar23;
            local_f68.field_2._8_8_ = plVar19[3];
            local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
          }
          else {
            local_f68.field_2._M_allocated_capacity = *psVar23;
          }
          local_f68._M_string_length = plVar19[1];
          *plVar19 = (long)psVar23;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_f00,inp);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e48,&local_f68,&local_f00);
          RuckigError::RuckigError(pRVar18,(string *)local_e48);
          __cxa_throw(pRVar18,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
        }
        (&traj->independent_min_durations)[uVar31]._M_elems[0] =
             *(double *)((long)&(this->blocks)._M_elems[0].t_min + lVar32 * 4);
        lVar24 = local_eb0;
      }
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + 0x240;
      lVar24 = lVar24 + 4;
      lVar34 = lVar34 + 4;
      lVar32 = lVar32 + 0x1be;
    } while (uVar31 < this->degrees_of_freedom);
    bVar38 = this->degrees_of_freedom != 1;
  }
  DVar7 = inp->duration_discretization;
  if ((!bVar38 &&
      ((inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged & 1U) == 0) && DVar7 != Discrete) {
    traj->duration = (this->blocks)._M_elems[0].t_min;
    memcpy((traj->profiles).
           super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start,&this->blocks,0x23c);
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = traj->duration;
    return Working;
  }
  local_f30 = '\0';
  poVar1 = &inp->minimum_duration;
  t_sync = &traj->duration;
  uVar11 = (poVar1->super__Optional_base<double,_true,_true>)._M_payload.
           super__Optional_payload_base<double>._M_payload;
  uVar12 = (poVar1->super__Optional_base<double,_true,_true>)._M_payload.
           super__Optional_payload_base<double>._M_engaged;
  uVar13 = *(undefined3 *)
            &(poVar1->super__Optional_base<double,_true,_true>)._M_payload.
             super__Optional_payload_base<double>.field_0x9;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_3_ = uVar13;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)uVar12;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)uVar11;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _12_4_ = 0;
  bVar38 = synchronize(this,t_min,t_sync,(optional<unsigned_long> *)&local_f38,
                       (traj->profiles).
                       super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,DVar7 == Discrete,local_eb8);
  sVar9 = this->degrees_of_freedom;
  if (!bVar38) {
    if (sVar9 != 0) {
      sVar20 = 0;
      do {
        dVar39 = (&inp->max_acceleration)[sVar20]._M_elems[0];
        if ((((dVar39 == 0.0) && (!NAN(dVar39))) ||
            ((dVar39 = (&this->inp_min_acceleration)[sVar20]._M_elems[0], dVar39 == 0.0 &&
             (!NAN(dVar39))))) ||
           ((dVar39 = (&inp->max_jerk)[sVar20]._M_elems[0], dVar39 == 0.0 && (!NAN(dVar39))))) {
          pRVar18 = (RuckigError *)__cxa_allocate_exception(0x10);
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_f68,vsnprintf,0x148,"%f",*t_sync);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e48,
                         "zero limits conflict with other degrees of freedom in time synchronization "
                         ,&local_f68);
          RuckigError::RuckigError(pRVar18,(string *)local_e48);
          __cxa_throw(pRVar18,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar20 = sVar20 + 1;
      } while (sVar9 != sVar20);
    }
    pRVar18 = (RuckigError *)__cxa_allocate_exception(0x10);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_f68,vsnprintf,0x148,"%f",*t_sync);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48,
                   "error in time synchronization: ",&local_f68);
    RuckigError::RuckigError(pRVar18,(string *)local_e48);
    __cxa_throw(pRVar18,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (sVar9 != 0) {
    pSVar27 = &this->blocks;
    lVar24 = 0;
    _Var36._M_value = 0;
    do {
      if (((&inp->enabled)[_Var36._M_value]._M_elems[0] == true) &&
         ((&this->inp_per_dof_synchronization)[_Var36._M_value]._M_elems[0] == None)) {
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar24),
               pSVar27,0x23c);
        dVar39 = pSVar27->_M_elems[0].t_min;
        if (traj->duration <= dVar39 && dVar39 != traj->duration) {
          *t_sync = dVar39;
          local_f30 = '\x01';
          local_f38 = _Var36;
        }
      }
      _Var36._M_value = _Var36._M_value + 1;
      lVar24 = lVar24 + 0x240;
      pSVar27 = pSVar27 + 1;
    } while (_Var36._M_value < this->degrees_of_freedom);
  }
  *(local_ec0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = *t_sync;
  dVar39 = *t_sync;
  if (7600.0 < dVar39) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar39 == 0.0) && (!NAN(dVar39))) {
    if (this->degrees_of_freedom == 0) {
      return Working;
    }
    pSVar27 = &this->blocks;
    lVar24 = 0;
    uVar37 = 0;
    do {
      memcpy((void *)((long)&((traj->profiles).
                              super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar24),
             pSVar27,0x23c);
      uVar37 = uVar37 + 1;
      pSVar27 = pSVar27 + 1;
      lVar24 = lVar24 + 0x240;
    } while (uVar37 < this->degrees_of_freedom);
    return Working;
  }
  if ((DVar7 != Discrete) &&
     (pSVar17 = std::
                __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>>
                          (&this->inp_per_dof_synchronization,&this->degrees_of_freedom),
     pSVar17 == (Synchronization *)&this->degrees_of_freedom)) {
    return Working;
  }
  if (local_f30 == '\x01') {
    pSVar21 = &this->inp_per_dof_synchronization;
    pCVar16 = (ControlInterface *)&this->degrees_of_freedom;
    pSVar17 = std::
              __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_pred<ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>>
                        (pSVar21,pCVar16);
    _Var36 = local_f38;
    if (pSVar17 != pCVar16) {
      if (local_f30 == '\0') {
        std::__throw_bad_optional_access();
      }
      paVar28 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar38 = is_input_collinear(this,inp,paVar28[local_f38._M_value]._M_elems[0].direction,
                                  local_f38._M_value);
      if (bVar38) {
        if (this->degrees_of_freedom != 0) {
          paVar28 = paVar28 + _Var36._M_value;
          bVar33 = 1;
          lVar24 = 0;
          uVar31 = 0;
          local_f40 = (StandardVector<Block,_1UL> *)pCVar16;
          local_f28 = pSVar21;
          do {
            if (((&inp->enabled)[uVar31]._M_elems[0] == true) &&
               (((local_f30 != '\x01' || (uVar31 != local_f38._M_value)) &&
                ((&this->inp_per_dof_synchronization)[uVar31]._M_elems[0] == Phase)))) {
              paVar10 = (traj->profiles).
                        super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              this_00 = (Profile *)((long)&paVar10->_M_elems[0].t + lVar24);
              *(double *)((long)&paVar10->_M_elems[0].t + lVar24 + 0x30) =
                   *(double *)((long)&paVar28->_M_elems[0].t + 0x30);
              uVar14 = paVar28->_M_elems[0].t._M_elems[0];
              dVar40 = *(double *)((long)&paVar28->_M_elems[0].t + 8);
              dVar42 = *(double *)((long)&paVar28->_M_elems[0].t + 0x10);
              dVar41 = *(double *)((long)&paVar28->_M_elems[0].t + 0x18);
              dVar39 = *(double *)((long)&paVar28->_M_elems[0].t + 0x28);
              pdVar4 = (double *)((long)&paVar10->_M_elems[0].t + lVar24 + 0x20);
              *pdVar4 = *(double *)((long)&paVar28->_M_elems[0].t + 0x20);
              pdVar4[1] = dVar39;
              pdVar4 = (double *)((long)&paVar10->_M_elems[0].t + lVar24 + 0x10);
              *pdVar4 = dVar42;
              pdVar4[1] = dVar41;
              puVar3 = (undefined8 *)((long)&paVar10->_M_elems[0].t + lVar24);
              *puVar3 = uVar14;
              puVar3[1] = dVar40;
              CVar8 = paVar28->_M_elems[0].control_signs;
              *(ControlSigns *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x78U) = CVar8;
              CVar6 = (&this->inp_per_dof_control_interface)[uVar31]._M_elems[0];
              if (CVar6 == Velocity) {
                if (CVar8 == UDUD) {
                  dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
                  dVar42 = (&this->new_phase_control)[uVar31]._M_elems[0];
                  if (ABS(dVar39) == INFINITY) {
                    bVar38 = false;
                    if ((dVar42 < (&inp->max_acceleration)[uVar31]._M_elems[0] + 1e-12) &&
                       ((&this->inp_min_acceleration)[uVar31]._M_elems[0] + -1e-12 < dVar42)) {
                      bVar38 = Profile::
                               check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar42);
                    }
                  }
                  else {
                    if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_001524a4;
                    bVar38 = Profile::
                             check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar42,(&inp->max_acceleration)[uVar31]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
                  }
                }
                else {
                  if (CVar8 != UDDU) goto LAB_001524a9;
                  dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
                  dVar42 = (&this->new_phase_control)[uVar31]._M_elems[0];
                  if (ABS(dVar39) == INFINITY) {
                    bVar38 = false;
                    if ((dVar42 < (&inp->max_acceleration)[uVar31]._M_elems[0] + 1e-12) &&
                       ((&this->inp_min_acceleration)[uVar31]._M_elems[0] + -1e-12 < dVar42)) {
                      bVar38 = Profile::
                               check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar42);
                    }
                  }
                  else {
                    if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_001524a4;
                    bVar38 = Profile::
                             check_for_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar42,(&inp->max_acceleration)[uVar31]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
                  }
                }
                goto LAB_001524a6;
              }
              if (CVar6 == Position) {
                if (CVar8 == UDUD) {
                  dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
                  dVar42 = (&this->new_phase_control)[uVar31]._M_elems[0];
                  if (ABS(dVar39) == INFINITY) {
                    dVar39 = (&this->inp_min_acceleration)[uVar31]._M_elems[0] + -1e-12;
                    if (dVar42 <= dVar39) {
LAB_001524a4:
                      bVar38 = false;
                    }
                    else {
                      dVar41 = -dVar42;
                      dVar40 = (&inp->max_acceleration)[uVar31]._M_elems[0] + 1e-12;
                      bVar38 = false;
                      if (((dVar41 < dVar40) && (dVar39 < dVar41)) && (dVar42 < dVar40)) {
                        bVar38 = Profile::
                                 check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                           (this_00,dVar42,dVar41,
                                            (&inp->max_velocity)[uVar31]._M_elems[0],
                                            (&this->inp_min_velocity)[uVar31]._M_elems[0]);
                      }
                    }
                  }
                  else {
                    if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_001524a4;
                    bVar38 = Profile::
                             check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                                       (this_00,dVar42,(&inp->max_velocity)[uVar31]._M_elems[0],
                                        (&this->inp_min_velocity)[uVar31]._M_elems[0],
                                        (&inp->max_acceleration)[uVar31]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
                  }
LAB_001524a6:
                  bVar33 = bVar33 & bVar38;
                }
                else if (CVar8 == UDDU) {
                  dVar39 = (&inp->max_jerk)[uVar31]._M_elems[0];
                  if (ABS(dVar39) == INFINITY) {
                    dVar39 = (&inp->max_acceleration)[uVar31]._M_elems[0];
                    dVar42 = (&this->new_phase_control)[uVar31]._M_elems[0];
                    if (ABS(dVar39) == INFINITY) {
                      bVar38 = false;
                      if ((dVar42 < (&inp->max_velocity)[uVar31]._M_elems[0] + 1e-12) &&
                         ((&this->inp_min_velocity)[uVar31]._M_elems[0] + -1e-12 < dVar42)) {
                        bVar38 = Profile::
                                 check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           (this_00,dVar42);
                      }
                    }
                    else {
                      dVar41 = (&this->inp_min_acceleration)[uVar31]._M_elems[0] + -1e-12;
                      if (dVar42 <= dVar41) goto LAB_001524a4;
                      dVar40 = -dVar42;
                      dVar39 = dVar39 + 1e-12;
                      bVar38 = false;
                      if (((dVar40 < dVar39) && (dVar42 < dVar39)) && (dVar41 < dVar40)) {
                        bVar38 = Profile::
                                 check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           (this_00,dVar42,dVar40,
                                            (&inp->max_velocity)[uVar31]._M_elems[0],
                                            (&this->inp_min_velocity)[uVar31]._M_elems[0]);
                      }
                    }
                  }
                  else {
                    dVar42 = (&this->new_phase_control)[uVar31]._M_elems[0];
                    if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_001524a4;
                    bVar38 = Profile::
                             check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                                       (this_00,dVar42,(&inp->max_velocity)[uVar31]._M_elems[0],
                                        (&this->inp_min_velocity)[uVar31]._M_elems[0],
                                        (&inp->max_acceleration)[uVar31]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
                  }
                  goto LAB_001524a6;
                }
              }
LAB_001524a9:
              *(ReachedLimits *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x70U) =
                   paVar28->_M_elems[0].limits;
            }
            uVar31 = uVar31 + 1;
            lVar24 = lVar24 + 0x240;
          } while (uVar31 < this->degrees_of_freedom);
          pSVar21 = local_f28;
          pCVar16 = (ControlInterface *)local_f40;
          if (bVar33 == 0) goto LAB_00152515;
        }
        pSVar17 = std::
                  __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>>
                            (pSVar21,pCVar16);
        if (pSVar17 == pCVar16) {
          return Working;
        }
        if (this->degrees_of_freedom == 0) {
          return Working;
        }
        goto LAB_00152523;
      }
    }
  }
LAB_00152515:
  if (this->degrees_of_freedom == 0) {
    return Working;
  }
LAB_00152523:
  pSVar27 = &this->blocks;
  pbVar35 = &(this->blocks)._M_elems[0].b.super__Optional_base<ruckig::Block::Interval,_true,_true>.
             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  lVar24 = 0;
  uVar31 = 0;
  local_f40 = pSVar27;
  do {
    if (((local_f30 == '\x01') && (uVar31 == local_f38._M_value)) ||
       (bVar38 = true, (&this->inp_per_dof_synchronization)[uVar31]._M_elems[0] == None)) {
      bVar38 = DVar7 == Discrete;
    }
    if ((bVar38 & (&inp->enabled)[uVar31]._M_elems[0]) == 1) {
      paVar28 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar39 = (traj->duration - *(double *)((long)&paVar28->_M_elems[0].brake + lVar24)) -
               *(double *)((long)&paVar28->_M_elems[0].accel + lVar24);
      if ((((&this->inp_per_dof_synchronization)[uVar31]._M_elems[0] != TimeIfNecessary) ||
          (2.220446049250313e-16 <= ABS((&inp->target_velocity)[uVar31]._M_elems[0]))) ||
         (2.220446049250313e-16 <= ABS((&inp->target_acceleration)[uVar31]._M_elems[0]))) {
        if (4.440892098500626e-16 <= ABS(dVar39 - *(double *)(pbVar35 + -0x4b0))) {
          if ((pbVar35[-600] != true) ||
             (4.440892098500626e-16 <= ABS(dVar39 - *(double *)(pbVar35 + -0x4a0)))) {
            if ((*pbVar35 != true) ||
               (4.440892098500626e-16 <= ABS(dVar39 - *(double *)(pbVar35 + -0x248)))) {
              CVar6 = (&this->inp_per_dof_control_interface)[uVar31]._M_elems[0];
              if (CVar6 == Velocity) {
                dVar42 = (&inp->max_jerk)[uVar31]._M_elems[0];
                if (ABS(dVar42) == INFINITY) {
                  ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                            ((VelocitySecondOrderStep2 *)local_e48,dVar39,
                             *(double *)((long)&paVar28->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x60U),
                             (&inp->max_acceleration)[uVar31]._M_elems[0],
                             (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
                  cVar15 = ruckig::VelocitySecondOrderStep2::get_profile(local_e48);
                }
                else {
                  ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                            ((VelocityThirdOrderStep2 *)local_e48,dVar39,
                             *(double *)((long)&paVar28->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar28->_M_elems[0].a + lVar24),
                             *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x60U),
                             *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x68U),
                             (&inp->max_acceleration)[uVar31]._M_elems[0],
                             (&this->inp_min_acceleration)[uVar31]._M_elems[0],dVar42);
                  cVar15 = ruckig::VelocityThirdOrderStep2::get_profile(local_e48);
                }
              }
              else {
                if (CVar6 != Position) goto LAB_00152ba1;
                dVar42 = (&inp->max_jerk)[uVar31]._M_elems[0];
                if (ABS(dVar42) == INFINITY) {
                  dVar42 = (&inp->max_acceleration)[uVar31]._M_elems[0];
                  if (ABS(dVar42) == INFINITY) {
                    ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                              ((PositionFirstOrderStep2 *)local_e48,dVar39,
                               *(double *)((long)&paVar28->_M_elems[0].p + lVar24),
                               *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x58U),
                               (&inp->max_velocity)[uVar31]._M_elems[0],
                               (&this->inp_min_velocity)[uVar31]._M_elems[0]);
                    cVar15 = ruckig::PositionFirstOrderStep2::get_profile(local_e48);
                  }
                  else {
                    ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                              ((PositionSecondOrderStep2 *)local_e48,dVar39,
                               *(double *)((long)&paVar28->_M_elems[0].p + lVar24),
                               *(double *)((long)&paVar28->_M_elems[0].v + lVar24),
                               *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x58U),
                               *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x60U),
                               (&inp->max_velocity)[uVar31]._M_elems[0],
                               (&this->inp_min_velocity)[uVar31]._M_elems[0],dVar42,
                               (&this->inp_min_acceleration)[uVar31]._M_elems[0]);
                    cVar15 = ruckig::PositionSecondOrderStep2::get_profile(local_e48);
                  }
                }
                else {
                  ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                            ((PositionThirdOrderStep2 *)local_e48,dVar39,
                             *(double *)((long)&paVar28->_M_elems[0].p + lVar24),
                             *(double *)((long)&paVar28->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar28->_M_elems[0].a + lVar24),
                             *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x58U),
                             *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x60U),
                             *(double *)((long)&paVar28->_M_elems[0].accel + lVar24 + 0x68U),
                             (&inp->max_velocity)[uVar31]._M_elems[0],
                             (&this->inp_min_velocity)[uVar31]._M_elems[0],
                             (&inp->max_acceleration)[uVar31]._M_elems[0],
                             (&this->inp_min_acceleration)[uVar31]._M_elems[0],dVar42);
                  cVar15 = ruckig::PositionThirdOrderStep2::get_profile(local_e48);
                }
              }
              pSVar27 = local_f40;
              if (cVar15 == '\0') {
LAB_00152ba1:
                pRVar18 = (RuckigError *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_e68,uVar31);
                std::operator+(&local_f00,"error in step 2 in dof: ",&local_e68);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_f00);
                local_f20._M_dataplus._M_p = (pointer)*plVar19;
                psVar23 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_f20._M_dataplus._M_p == psVar23) {
                  local_f20.field_2._M_allocated_capacity = *psVar23;
                  local_f20.field_2._8_8_ = plVar19[3];
                  local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
                }
                else {
                  local_f20.field_2._M_allocated_capacity = *psVar23;
                }
                local_f20._M_string_length = plVar19[1];
                *plVar19 = (long)psVar23;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                          (&local_e88,vsnprintf,0x148,"%f",*t_sync);
                std::operator+(&local_ee0,&local_f20,&local_e88);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_ee0);
                local_f68._M_dataplus._M_p = (pointer)*plVar19;
                psVar23 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_f68._M_dataplus._M_p == psVar23) {
                  local_f68.field_2._M_allocated_capacity = *psVar23;
                  local_f68.field_2._8_8_ = plVar19[3];
                  local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
                }
                else {
                  local_f68.field_2._M_allocated_capacity = *psVar23;
                }
                local_f68._M_string_length = plVar19[1];
                *plVar19 = (long)psVar23;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_ea8,inp);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e48,&local_f68,&local_ea8);
                RuckigError::RuckigError(pRVar18,(string *)local_e48);
                __cxa_throw(pRVar18,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
              }
              goto LAB_00152934;
            }
            __src = (StandardVector<Block,_1UL> *)
                    ((long)&pSVar27[uVar31]._M_elems[0].b.
                            super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                            super__Optional_payload_base<ruckig::Block::Interval>._M_payload + 0x10)
            ;
          }
          else {
            __src = (StandardVector<Block,_1UL> *)
                    ((long)&pSVar27[uVar31]._M_elems[0].a.
                            super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                            super__Optional_payload_base<ruckig::Block::Interval>._M_payload + 0x10)
            ;
          }
        }
        else {
          __src = (StandardVector<Block,_1UL> *)(pbVar35 + -0x6f0);
        }
      }
      else {
        __src = pSVar27 + uVar31;
      }
      memcpy((void *)((long)&paVar28->_M_elems[0].t + lVar24),__src,0x23c);
    }
LAB_00152934:
    uVar31 = uVar31 + 1;
    pbVar35 = pbVar35 + 0x6f8;
    lVar24 = lVar24 + 0x240;
    if (this->degrees_of_freedom <= uVar31) {
      return Working;
    }
  } while( true );
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }